

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fvrf_data.c
# Opt level: O2

int iterdata(long totaln,long offset,long firstn,long nrows,int narray,iteratorCol *iter_col,
            void *usrdata)

{
  double dVar1;
  char cVar2;
  int iVar3;
  uint uVar4;
  long lVar5;
  void *pvVar6;
  ulong uVar7;
  size_t sVar8;
  char *pcVar9;
  undefined8 *puVar10;
  char *pcVar11;
  double *pdVar12;
  long lVar13;
  long lVar14;
  iteratorCol *piVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  
  if (firstn == 1) {
    iterdata::usrpt = (UserIter *)usrdata;
    iterdata::hdupt = *(FitsHdu **)((long)usrdata + 0x40);
    iterdata::nnum = *usrdata;
    iterdata::ncmp = *(int *)((long)usrdata + 4);
    iterdata::ntxt = *(int *)((long)usrdata + 0x38);
    iterdata::nfloat = *(int *)((long)usrdata + 8);
    iterdata::flag_minmax = (int *)calloc((long)(iterdata::ncmp + iterdata::nnum),4);
    iterdata::repeat = (long *)calloc((long)narray,8);
    iterdata::datatype = (int *)calloc((long)narray,4);
    uVar17 = 0;
    piVar15 = iter_col;
    uVar7 = (ulong)(uint)narray;
    if (narray < 1) {
      uVar7 = uVar17;
    }
    for (; uVar7 != uVar17; uVar17 = uVar17 + 1) {
      lVar5 = fits_iter_get_repeat(piVar15);
      iterdata::repeat[uVar17] = lVar5;
      iVar3 = fits_iter_get_datatype(piVar15);
      iterdata::datatype[uVar17] = iVar3;
      piVar15 = piVar15 + 1;
    }
    iterdata_find_badspace = '\0';
    iterdata_find_badlog = '\0';
  }
  lVar5 = 0;
  if (0 < nrows) {
    lVar5 = nrows;
  }
  uVar7 = (ulong)(uint)iterdata::nnum;
  lVar16 = 0;
  do {
    if (iterdata::ncmp + (int)uVar7 <= lVar16) {
      lVar16 = (long)(int)uVar7 + (long)iterdata::ncmp;
      do {
        lVar14 = (long)(iterdata::ncmp + (int)uVar7 + iterdata::ntxt);
        if (lVar14 <= lVar16) {
          do {
            if ((long)(iterdata::ncmp + (int)uVar7 + iterdata::ntxt) + (long)iterdata::nfloat <=
                lVar14) {
              if (nrows + firstn + -1 == totaln) {
                free(iterdata::flag_minmax);
                free(iterdata::datatype);
                free(iterdata::repeat);
              }
              return 0;
            }
            if (nrows != 0) {
              piVar15 = iter_col + lVar14;
              puVar10 = (undefined8 *)fits_iter_get_array(piVar15);
              iterdata_find_badspace = '\0';
              lVar16 = 0;
              do {
                do {
                  lVar18 = lVar16;
                  if (lVar18 == lVar5) goto LAB_00108107;
                  lVar16 = lVar18 + 1;
                  pcVar9 = (char *)puVar10[lVar18 + 1];
                  iVar3 = strcmp((char *)*puVar10,pcVar9);
                } while ((iVar3 == 0) || (pcVar11 = strchr(pcVar9,0x2e), pcVar11 != (char *)0x0));
                for (; *pcVar9 == ' '; pcVar9 = pcVar9 + 1) {
                }
              } while (*pcVar9 == '\0');
              uVar4 = fits_iter_get_colnum(piVar15);
              sprintf(errmes,"Number in row #%ld, column #%d has no decimal point:",lVar18 + firstn,
                      (ulong)uVar4);
              wrterr(iterdata::usrpt->out,errmes,1);
              strcpy(errmes,pcVar9);
              sVar8 = strlen(errmes);
              builtin_strncpy(errmes + sVar8 + 0x20,"rrors).",8);
              builtin_strncpy(errmes + sVar8,"  (Other",8);
              builtin_strncpy(errmes + sVar8 + 8," rows ma",8);
              builtin_strncpy(errmes + sVar8 + 0x10,"y have s",8);
              builtin_strncpy(errmes + sVar8 + 0x18,"imilar e",8);
              print_fmt(iterdata::usrpt->out,errmes,0xd);
              if (iterdata_find_badspace == '\0') {
LAB_00108107:
                lVar16 = 0;
                do {
                  do {
                    lVar18 = lVar16;
                    if (lVar18 == lVar5) goto LAB_00108209;
                    pcVar9 = (char *)puVar10[lVar18 + 1];
                    iVar3 = strcmp((char *)*puVar10,pcVar9);
                    lVar16 = lVar18 + 1;
                  } while (iVar3 == 0);
                  pcVar9 = pcVar9 + -1;
                  do {
                    pcVar11 = pcVar9;
                    pcVar9 = pcVar11 + 1;
                  } while (pcVar11[1] == ' ');
                  sVar8 = strlen(pcVar9);
                  for (pcVar11 = pcVar11 + sVar8;
                      (sVar8 = sVar8 - 1, 0 < (long)sVar8 && (*pcVar11 == ' '));
                      pcVar11 = pcVar11 + -1) {
                    *pcVar11 = '\0';
                  }
                  pcVar11 = strchr(pcVar9,0x20);
                } while (pcVar11 == (char *)0x0);
                uVar4 = fits_iter_get_colnum(piVar15);
                sprintf(errmes,"Number in row #%ld, column #%d has embedded space:",lVar18 + firstn,
                        (ulong)uVar4);
                wrterr(iterdata::usrpt->out,errmes,1);
                strcpy(errmes,pcVar9);
                sVar8 = strlen(errmes);
                builtin_strncpy(errmes + sVar8 + 0x20,"rrors).",8);
                builtin_strncpy(errmes + sVar8,"  (Other",8);
                builtin_strncpy(errmes + sVar8 + 8," rows ma",8);
                builtin_strncpy(errmes + sVar8 + 0x10,"y have s",8);
                builtin_strncpy(errmes + sVar8 + 0x18,"imilar e",8);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                iterdata_find_badspace = '\x01';
              }
            }
LAB_00108209:
            lVar14 = lVar14 + 1;
            uVar7 = (ulong)(uint)iterdata::nnum;
          } while( true );
        }
        if (iterdata::datatype[lVar16] == 0x10) {
          if (nrows != 0) {
            pvVar6 = fits_iter_get_array(iter_col + lVar16);
            lVar14 = 0;
LAB_00107e0e:
            lVar18 = lVar14;
            if (lVar18 != lVar5) {
              pcVar9 = *(char **)((long)pvVar6 + lVar18 * 8 + 8);
              do {
                cVar2 = *pcVar9;
                lVar14 = lVar18 + 1;
                if (cVar2 == '\0') goto LAB_00107e0e;
                pcVar9 = pcVar9 + 1;
              } while (0xa0 < (byte)(cVar2 + 0x81U));
              uVar4 = fits_iter_get_colnum(iter_col + lVar16);
              sprintf(errmes,"String in row #%ld, column #%d contains non-ASCII text.",
                      lVar18 + firstn,(ulong)uVar4);
              wrterr(iterdata::usrpt->out,errmes,1);
              builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
              print_fmt(iterdata::usrpt->out,errmes,0xd);
              goto LAB_00107e0e;
            }
          }
        }
        else if (iterdata::repeat[lVar16] * nrows != 0) {
          pvVar6 = fits_iter_get_array(iter_col + lVar16);
          if (iterdata_find_badlog == '\0') {
            lVar14 = iterdata::repeat[lVar16];
            lVar18 = lVar14 * nrows;
            if (lVar18 < 1) {
              lVar18 = 0;
            }
            for (lVar13 = 0; lVar18 != lVar13; lVar13 = lVar13 + 1) {
              if (2 < *(byte *)((long)pvVar6 + lVar13 + 1)) {
                uVar4 = fits_iter_get_colnum(iter_col + lVar16);
                sprintf(errmes,
                        "Logical value in row #%ld, column #%d not equal to \'T\', \'F\', or 0",
                        (lVar13 + firstn + -1) / lVar14 + 1,(ulong)uVar4);
                wrterr(iterdata::usrpt->out,errmes,1);
                builtin_strncpy(errmes,"             (Other rows may have similar errors).",0x33);
                print_fmt(iterdata::usrpt->out,errmes,0xd);
                iterdata_find_badlog = '\x01';
                break;
              }
            }
          }
        }
        lVar16 = lVar16 + 1;
        uVar7 = (ulong)(uint)iterdata::nnum;
      } while( true );
    }
    pvVar6 = fits_iter_get_array(iter_col + lVar16);
    uVar7 = (ulong)iterdata::nnum;
    lVar14 = iterdata::repeat[lVar16];
    if (((nrows << ((long)uVar7 <= lVar16)) * lVar14 != 0) &&
       (iterdata::usrpt->indatatyp[lVar16] == 1)) {
      pdVar12 = (double *)(lVar14 * 8 + (long)pvVar6);
      lVar18 = -8;
      lVar13 = 1;
      do {
        if (lVar5 + lVar13 == 1) goto LAB_00107d9b;
        dVar1 = *pdVar12;
        lVar13 = lVar13 + -1;
        pdVar12 = pdVar12 + lVar14;
        lVar18 = lVar18 + 8;
      } while ((iterdata::usrpt->mask[lVar16] & (byte)(int)dVar1) == 0);
      uVar4 = fits_iter_get_colnum(iter_col + lVar16);
      sprintf(errmes,"Row #%ld, and Column #%d: X vector ",firstn - lVar13,(ulong)uVar4);
      for (lVar14 = 1; lVar14 <= iterdata::repeat[lVar16]; lVar14 = lVar14 + 1) {
        sprintf(comm,"0x%02x ",
                (ulong)((int)*(double *)
                              ((long)pvVar6 + lVar14 * 8 + iterdata::repeat[lVar16] * lVar18) & 0xff
                       ));
        strcat(errmes,comm);
      }
      sVar8 = strlen(errmes);
      builtin_strncpy(errmes + sVar8 + 0xf,"tified.",8);
      builtin_strncpy(errmes + sVar8,"is not l",8);
      builtin_strncpy(errmes + sVar8 + 8,"eft just",8);
      wrterr(iterdata::usrpt->out,errmes,2);
      builtin_strncpy(errmes,"             (Other rows may have errors).",0x2b);
      print_fmt(iterdata::usrpt->out,errmes,0xd);
      uVar7 = (ulong)(uint)iterdata::nnum;
    }
LAB_00107d9b:
    lVar16 = lVar16 + 1;
  } while( true );
}

Assistant:

int iterdata(long totaln, 
		 long offset, 
		 long firstn,
		 long nrows,
		 int narray,
		 iteratorCol *iter_col,
		 void *usrdata
		 )
{ 
    static UserIter *usrpt;
    static FitsHdu  *hdupt;
    static int nnum;
    static int ntxt;
    static int ncmp;
    static int nfloat;
    static int *flag_minmax = 0;			/* define the initial min and max value */
    static long *repeat;
    static int *datatype;
    static int find_badbit = 0; 
    static int find_baddot = 0; 
    static int find_badspace = 0; 
    static int find_badchar = 0; 
    static int find_badlog = 0; 

    double  *data;
    unsigned char *ldata;
    char **cdata;
    unsigned char *ucdata;
    char *floatvalue;

    /* bit column working space */
    static unsigned char bdata;

    int i; 
    long j,k,l;
    long nelem;

    int flag_cmpnull = 0;

    if(firstn == 1 ) {  /* first time for this table, so initialize */
        usrpt = (UserIter *)usrdata;
	hdupt= usrpt->hduptr;
        nnum = usrpt->nnum;
        ncmp = usrpt->ncmp;
        ntxt = usrpt->ntxt;
        nfloat = usrpt->nfloat;
	flag_minmax = (int *)calloc(nnum+ncmp, sizeof(int));
	repeat   = (long *)calloc(narray,sizeof(long));
	datatype = (int *)calloc(narray,sizeof(int));
        for (i=0; i < narray; i++) {  
	    repeat[i] = fits_iter_get_repeat(&(iter_col[i]));
	    datatype[i] = fits_iter_get_datatype(&(iter_col[i])); 
        }
        find_badbit = 0; 
        find_baddot = 0; 
        find_badspace = 0; 
        find_badchar = 0; 
        find_badlog = 0; 
    }

    /* columns from  1 to nnum are scalar numerical columns. 
       columns from  nnum+1 to  nnum+ncmp are complex columns. (not used any more)
       columns from  nnum+ncmp are text columns */

    /* deal with the numerical column */
    for (i=0; i < nnum+ncmp; i++) { 
	data = (double *) fits_iter_get_array(&(iter_col[i]));
	j = 1;
	flag_cmpnull = 0;
	nelem = nrows * repeat[i];
	if(i >= nnum) nelem = 2 * nrows *repeat[i];
	if(nelem == 0) continue;
        find_badbit = 0;

        /* check for the bit jurisfication  */
        if(!find_badbit && usrpt->indatatyp[i] == TBIT ) { 
            for (k = 0; k < nrows; k++) {
               j = (k+1)*repeat[i];
               bdata = (unsigned char)data[j]; 
               if( bdata & usrpt->mask[i] ) { 
                  sprintf(errmes, 
                    "Row #%ld, and Column #%d: X vector ", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                  for (l = 1; l<= repeat[i]; l++) {
                     sprintf(comm, "0x%02x ", (unsigned char) data[k*repeat[i]+l]);
                     strcat(errmes,comm); 
                  }
                  strcat(errmes,"is not left justified."); 
                  wrterr(usrpt->out,errmes,2);
                  strcpy(errmes,
          "             (Other rows may have errors).");
                  print_fmt(usrpt->out,errmes,13);
                  find_badbit = 1;
                  break;
               }
            }
        }  
    }

    /* deal with character and logical columns */
    for (i = nnum + ncmp; i < nnum + ncmp + ntxt; i++) { 
        if(datatype[i] == TSTRING ) {	/* character */
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_badchar = 0;

            /* test for illegal ASCII text characters > 126  or < 32 */
            if (!find_badchar) {
              for (k = 0; k < nrows; k++) {
                ucdata = (unsigned char *)cdata[k+1];
                j = 0;
                while (ucdata[j] != 0) {

                  if ((ucdata[j] > 126) || (ucdata[j] < 32)) {
                    sprintf(errmes, 
                    "String in row #%ld, column #%d contains non-ASCII text.", firstn+k, 
                      fits_iter_get_colnum(&(iter_col[i]))); 
                      wrterr(usrpt->out,errmes,1);
                      strcpy(errmes,
          "             (Other rows may have errors).");
                      print_fmt(usrpt->out,errmes,13);
                    find_badchar = 1;
                    break;
                  }
                  j++;
                }
              }
            }
        }

	else {  			/* logical value */
            nelem = nrows * repeat[i];
	    if(nelem == 0) continue;
	    ldata = (unsigned char *) fits_iter_get_array(&(iter_col[i]));

            /* test for illegal logical column values */
            /* The first element in the array gives the value that is used to represent nulls */
            if (!find_badlog) {
                for(j = 1; j <= nrows * repeat[i]; j++) {
                  if (ldata[j] > 2) {
                    sprintf(errmes, 
                    "Logical value in row #%ld, column #%d not equal to 'T', 'F', or 0", 
                       (firstn+j - 2)/repeat[i] +1, 
                       fits_iter_get_colnum(&(iter_col[i]))); 
                       wrterr(usrpt->out,errmes,1);
                       strcpy(errmes,
         "             (Other rows may have similar errors).");
                       print_fmt(usrpt->out,errmes,13);
                       find_badlog = 1;
                       break; 
                  }
                }
            }
        }
    }

    for (i = nnum + ncmp +ntxt; i < nnum + ncmp + ntxt + nfloat; i++) { 
            nelem = nrows;
	    if(nelem == 0) continue;
	    cdata = (char **) fits_iter_get_array(&(iter_col[i]));
            find_baddot = 0;
	    find_badspace = 0;

            /* test for missing (implicit) decimal point in floating point numbers */
            if (!find_baddot) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];
                if (strcmp(cdata[0], floatvalue) && !strchr(floatvalue, '.') ) {

		  while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                  if (strlen(floatvalue)) {  /* ignore completely blank fields */
		  
                    sprintf(errmes, 
                     "Number in row #%ld, column #%d has no decimal point:", firstn+k, 
                     fits_iter_get_colnum(&(iter_col[i]))); 
                     wrterr(usrpt->out,errmes,1);
                     strcpy(errmes, floatvalue);
                     strcat(errmes,
                  "  (Other rows may have similar errors).");
                     print_fmt(usrpt->out,errmes,13);
                     find_baddot = 1;
                     break;
                  }
                }
              }
            }

            if (!find_badspace) {
              for (k = 0; k < nrows; k++) {
                floatvalue = (char *)cdata[k+1];

                if (strcmp(cdata[0], floatvalue) ) {  /* not a null value? */
		    while (*floatvalue == ' ')  /* skip leading spaces */
		        floatvalue++;

                    l = strlen(floatvalue) - 1;
		    while (l > 0 &&  floatvalue[l] == ' ') { /* remove trailing spaces */
		        floatvalue[l] = '\0';
			l--;
		    }

                    if (strchr(floatvalue, ' ') ) {
                      sprintf(errmes, 
                       "Number in row #%ld, column #%d has embedded space:", firstn+k, 
                         fits_iter_get_colnum(&(iter_col[i]))); 
                         wrterr(usrpt->out,errmes,1);
                         strcpy(errmes, floatvalue);
                         strcat(errmes,
                      "  (Other rows may have similar errors).");
                         print_fmt(usrpt->out,errmes,13);
                         find_badspace = 1;
                         break;
                    }
		}
            }
          }
    }

    if(firstn + nrows - 1 == totaln) { 
	free(flag_minmax);
	free(datatype);
	free(repeat); 
    }
    return 0; 
}